

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring_agg.cpp
# Opt level: O0

void duckdb::BitStringAggOperation::
     Execute<duckdb::hugeint_t,duckdb::BitAggState<duckdb::hugeint_t>>
               (BitAggState<duckdb::hugeint_t> *state,hugeint_t input,hugeint_t min)

{
  OutOfRangeException *this;
  hugeint_t hVar1;
  bool bVar2;
  int64_t extraout_RDX;
  long in_RDI;
  idx_t val;
  allocator local_61;
  string local_60 [32];
  uint64_t local_40;
  int64_t local_38;
  ulong local_30;
  long local_28;
  hugeint_t local_20;
  hugeint_t local_10;
  
  local_28 = in_RDI;
  local_40 = duckdb::hugeint_t::operator-(&local_10,&local_20);
  hVar1.upper = extraout_RDX;
  hVar1.lower = local_40;
  local_38 = extraout_RDX;
  bVar2 = duckdb::Hugeint::TryCast<unsigned_long>(hVar1,&local_30);
  if (!bVar2) {
    this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,"Range too large for bitstring aggregation",&local_61);
    duckdb::OutOfRangeException::OutOfRangeException(this,local_60);
    __cxa_throw(this,&OutOfRangeException::typeinfo,OutOfRangeException::~OutOfRangeException);
  }
  duckdb::Bit::SetBit((string_t *)(local_28 + 8),local_30,1);
  return;
}

Assistant:

void BitStringAggOperation::Execute(BitAggState<hugeint_t> &state, hugeint_t input, hugeint_t min) {
	idx_t val;
	if (Hugeint::TryCast(input - min, val)) {
		Bit::SetBit(state.value, val, 1);
	} else {
		throw OutOfRangeException("Range too large for bitstring aggregation");
	}
}